

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O0

bool __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::parse<unsigned_long,cmake*>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> *this,string *input,
          unsigned_long *index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *allArgs,cmake **state)

{
  pointer pbVar1;
  undefined8 uVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  undefined1 *puVar6;
  const_reference pvVar7;
  char *pcVar8;
  undefined1 *puVar9;
  size_type sVar10;
  cmAlphaNum local_278;
  cmAlphaNum local_248;
  string local_218;
  undefined1 local_1f8 [8];
  string value_1;
  cmAlphaNum local_1a8;
  string local_178;
  undefined1 local_158 [8];
  string buffer;
  unsigned_long nextValueIndex_1;
  cmAlphaNum local_100;
  string local_d0;
  undefined1 local_b0 [8];
  string value;
  unsigned_long nextValueIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ParseMode local_34;
  cmake **ppcStack_30;
  ParseMode parseState;
  cmake **state_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *allArgs_local;
  unsigned_long *index_local;
  string *input_local;
  cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
  *this_local;
  
  local_34 = 0;
  ppcStack_30 = state;
  state_local = (cmake **)allArgs;
  allArgs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)index;
  index_local = (unsigned_long *)input;
  input_local = (string *)this;
  if (*(int *)(this + 0x60) == 0) {
    lVar4 = std::__cxx11::string::size();
    lVar5 = std::__cxx11::string::size();
    if (lVar4 == lVar5) {
      std::__cxx11::string::string((string *)&local_58);
      bVar3 = std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
              ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                            *)(this + 0x68),&local_58,*ppcStack_30);
      local_34 = (ParseMode)!bVar3;
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      local_34 = 2;
    }
  }
  else if ((*(int *)(this + 0x60) == 1) || (*(int *)(this + 0x60) == 3)) {
    lVar4 = std::__cxx11::string::size();
    lVar5 = std::__cxx11::string::size();
    if (lVar4 == lVar5) {
      puVar9 = &((allArgs_local->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->field_0x1;
      puVar6 = (undefined1 *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)state_local);
      if (puVar9 < puVar6) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)state_local,(size_type)puVar9);
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
        if (*pcVar8 != '-') {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)state_local,(size_type)puVar9);
          bVar3 = std::
                  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                                *)(this + 0x68),pvVar7,*ppcStack_30);
          local_34 = (ParseMode)!bVar3;
          (allArgs_local->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)puVar9;
          goto LAB_0031e355;
        }
      }
      if (*(int *)(this + 0x60) == 3) {
        std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
        bVar3 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                              *)(this + 0x68),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (value.field_2._M_local_buf + 8),*ppcStack_30);
        local_34 = (ParseMode)!bVar3;
        std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      }
      else {
        local_34 = 3;
      }
    }
    else {
      cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
      ::extract_single_value
                ((string *)local_b0,
                 (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  *)this,(string *)index_local,&local_34);
      if (local_34 == 0) {
        bVar3 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                              *)(this + 0x68),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b0,*ppcStack_30);
        local_34 = (ParseMode)!bVar3;
      }
      std::__cxx11::string::~string((string *)local_b0);
    }
  }
  else if (*(int *)(this + 0x60) == 2) {
    lVar4 = std::__cxx11::string::size();
    lVar5 = std::__cxx11::string::size();
    if (lVar4 == lVar5) {
      pbVar1 = (allArgs_local->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar9 = (undefined1 *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)state_local);
      if (&pbVar1->field_0x2 < puVar9) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)state_local,
                              (size_type)
                              &((allArgs_local->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->field_0x1);
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
        if (*pcVar8 != '-') {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)state_local,
                                (size_type)
                                &((allArgs_local->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->field_0x2);
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
          if (*pcVar8 != '-') {
            (allArgs_local->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&((allArgs_local->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->field_0x2;
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)state_local,
                                  (size_type)
                                  ((long)&(allArgs_local->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[-1].field_2 +
                                  0xf));
            cmAlphaNum::cmAlphaNum(&local_100,pvVar7);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&nextValueIndex_1,";");
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)state_local,
                                  (size_type)
                                  (allArgs_local->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
            cmStrCat<std::__cxx11::string>
                      (&local_d0,&local_100,(cmAlphaNum *)&nextValueIndex_1,pvVar7);
            bVar3 = std::
                    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                    ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                                  *)(this + 0x68),&local_d0,*ppcStack_30);
            local_34 = (ParseMode)!bVar3;
            std::__cxx11::string::~string((string *)&local_d0);
            goto LAB_0031e355;
          }
        }
      }
      local_34 = 3;
    }
  }
  else if (*(int *)(this + 0x60) == 4) {
    lVar4 = std::__cxx11::string::size();
    lVar5 = std::__cxx11::string::size();
    if (lVar4 == lVar5) {
      puVar9 = &((allArgs_local->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->field_0x1;
      buffer.field_2._8_8_ = puVar9;
      puVar6 = (undefined1 *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)state_local);
      if (puVar9 < puVar6) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)state_local,buffer.field_2._8_8_);
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
        uVar2 = buffer.field_2._8_8_;
        if (*pcVar8 != '-') {
          buffer.field_2._8_8_ = buffer.field_2._8_8_ + 1;
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)state_local,uVar2);
          std::__cxx11::string::string((string *)local_158,(string *)pvVar7);
          while( true ) {
            uVar2 = buffer.field_2._8_8_;
            sVar10 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)state_local);
            bVar3 = false;
            if ((ulong)uVar2 < sVar10) {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)state_local,buffer.field_2._8_8_);
              pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
              bVar3 = *pcVar8 != '-';
            }
            if (!bVar3) break;
            cmAlphaNum::cmAlphaNum(&local_1a8,(string *)local_158);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&value_1.field_2 + 8),";");
            uVar2 = buffer.field_2._8_8_;
            buffer.field_2._8_8_ = buffer.field_2._8_8_ + 1;
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)state_local,uVar2);
            cmStrCat<std::__cxx11::string>
                      (&local_178,&local_1a8,(cmAlphaNum *)((long)&value_1.field_2 + 8),pvVar7);
            std::__cxx11::string::operator=((string *)local_158,(string *)&local_178);
            std::__cxx11::string::~string((string *)&local_178);
          }
          bVar3 = std::
                  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                                *)(this + 0x68),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_158,*ppcStack_30);
          local_34 = (ParseMode)!bVar3;
          (allArgs_local->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)(buffer.field_2._8_8_ + -1);
          std::__cxx11::string::~string((string *)local_158);
          goto LAB_0031e355;
        }
      }
      local_34 = 3;
    }
    else {
      cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
      ::extract_single_value
                ((string *)local_1f8,
                 (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  *)this,(string *)index_local,&local_34);
      if (local_34 == 0) {
        bVar3 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                ::operator()((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                              *)(this + 0x68),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1f8,*ppcStack_30);
        local_34 = (ParseMode)!bVar3;
      }
      std::__cxx11::string::~string((string *)local_1f8);
    }
  }
LAB_0031e355:
  if (local_34 == 2) {
    cmAlphaNum::cmAlphaNum(&local_248,"\'");
    cmAlphaNum::cmAlphaNum(&local_278,(string *)index_local);
    cmStrCat<char[2],std::__cxx11::string>
              (&local_218,&local_248,&local_278,(char (*) [2])0xdf4454,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    cmSystemTools::Error(&local_218);
    std::__cxx11::string::~string((string *)&local_218);
  }
  else if (local_34 == 3) {
    cmSystemTools::Error((string *)(this + 0x20));
  }
  return local_34 == 0;
}

Assistant:

bool parse(std::string const& input, T& index,
             std::vector<std::string> const& allArgs,
             CallState&&... state) const
  {
    ParseMode parseState = ParseMode::Valid;

    if (this->Type == Values::Zero) {
      if (input.size() == this->Name.size()) {
        parseState =
          this->StoreCall(std::string{}, std::forward<CallState>(state)...)
          ? ParseMode::Valid
          : ParseMode::Invalid;
      } else {
        parseState = ParseMode::SyntaxError;
      }

    } else if (this->Type == Values::One || this->Type == Values::ZeroOrOne) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          if (this->Type == Values::ZeroOrOne) {
            parseState =
              this->StoreCall(std::string{}, std::forward<CallState>(state)...)
              ? ParseMode::Valid
              : ParseMode::Invalid;
          } else {
            parseState = ParseMode::ValueError;
          }
        } else {
          parseState = this->StoreCall(allArgs[nextValueIndex],
                                       std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = nextValueIndex;
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::Two) {
      if (input.size() == this->Name.size()) {
        if (index + 2 >= allArgs.size() || allArgs[index + 1][0] == '-' ||
            allArgs[index + 2][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          index += 2;
          parseState =
            this->StoreCall(cmStrCat(allArgs[index - 1], ";", allArgs[index]),
                            std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::OneOrMore) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          std::string buffer = allArgs[nextValueIndex++];
          while (nextValueIndex < allArgs.size() &&
                 allArgs[nextValueIndex][0] != '-') {
            buffer = cmStrCat(buffer, ";", allArgs[nextValueIndex++]);
          }
          parseState =
            this->StoreCall(buffer, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = (nextValueIndex - 1);
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    }

    if (parseState == ParseMode::SyntaxError) {
      cmSystemTools::Error(
        cmStrCat("'", input, "'", this->InvalidSyntaxMessage));
    } else if (parseState == ParseMode::ValueError) {
      cmSystemTools::Error(this->InvalidValueMessage);
    }
    return (parseState == ParseMode::Valid);
  }